

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSatLE.c
# Opt level: O0

int Sle_SetCutIsContainedOrder(int *pBase,int *pCut)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  int *piVar4;
  int *pLeaveC;
  int *pLeaveB;
  int nSizeC;
  int k;
  int nSizeB;
  int i;
  int *pCut_local;
  int *pBase_local;
  
  iVar1 = Sle_CutSize(pBase);
  iVar2 = Sle_CutSize(pCut);
  piVar3 = Sle_CutLeaves(pBase);
  piVar4 = Sle_CutLeaves(pCut);
  if (iVar1 == iVar2) {
    for (k = 0; k < iVar1; k = k + 1) {
      if (piVar3[k] != piVar4[k]) {
        return 0;
      }
    }
    pBase_local._4_4_ = 1;
  }
  else {
    if (iVar1 <= iVar2) {
      __assert_fail("nSizeB > nSizeC",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSatLE.c"
                    ,0x83,"int Sle_SetCutIsContainedOrder(int *, int *)");
    }
    if (iVar2 == 0) {
      pBase_local._4_4_ = 1;
    }
    else {
      pLeaveB._4_4_ = 0;
      for (k = 0; k < iVar1; k = k + 1) {
        if (piVar4[pLeaveB._4_4_] < piVar3[k]) {
          return 0;
        }
        if ((piVar3[k] == piVar4[pLeaveB._4_4_]) &&
           (pLeaveB._4_4_ = pLeaveB._4_4_ + 1, pLeaveB._4_4_ == iVar2)) {
          return 1;
        }
      }
      pBase_local._4_4_ = 0;
    }
  }
  return pBase_local._4_4_;
}

Assistant:

static inline int Sle_SetCutIsContainedOrder( int * pBase, int * pCut ) // check if pCut is contained in pBase
{
    int i, nSizeB = Sle_CutSize(pBase);
    int k, nSizeC = Sle_CutSize(pCut);
    int * pLeaveB = Sle_CutLeaves(pBase);
    int * pLeaveC = Sle_CutLeaves(pCut);
    if ( nSizeB == nSizeC )
    {
        for ( i = 0; i < nSizeB; i++ )
            if ( pLeaveB[i] != pLeaveC[i] )
                return 0;
        return 1;
    }
    assert( nSizeB > nSizeC ); 
    if ( nSizeC == 0 )
        return 1;
    for ( i = k = 0; i < nSizeB; i++ )
    {
        if ( pLeaveB[i] > pLeaveC[k] )
            return 0;
        if ( pLeaveB[i] == pLeaveC[k] )
        {
            if ( ++k == nSizeC )
                return 1;
        }
    }
    return 0;
}